

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O1

bool __thiscall string_parser::next(string_parser *this,string *str,uint64_t *offset,size_t *room)

{
  *offset = this->_offset;
  (this->_str)._M_string_length = 0;
  *(this->_str)._M_dataplus._M_p = '\0';
  do_read(this,true,false);
  do_read(this,false,true);
  do_read(this,false,false);
  do_read(this,false,true);
  *room = this->_offset - *offset;
  std::__cxx11::string::_M_assign((string *)str);
  return str->_M_string_length != 0;
}

Assistant:

bool next(std::string& str, uint64_t& offset, size_t& room)
	{
		offset = _offset; // current offset
		_str.clear();

		try {
			do_read(true,  false); // main string
			do_read(false, true);  // zeros
			do_read(false, false); // sshash pad
			do_read(false, true);  // zeros
		} catch (std::exception& e) {
			std::cerr << "failed to read next string: " << e.what() << '\n';
			return false;
		}

		room = _offset - offset;
		str  = _str;
		return !str.empty();
	}